

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O2

target_ulong
helper_dextr_rs_l_mips64(target_ulong ac,target_ulong shift,CPUMIPSState_conflict5 *env)

{
  byte *pbVar1;
  ulong uVar2;
  ulong uVar3;
  uint64_t local_28;
  long local_20;
  ulong local_18;
  
  mipsdsp_rndrashift_acc(&local_28,(uint32_t)ac,(uint)shift & 0x3f,env);
  uVar2 = local_28 + 1;
  if ((uVar2 == 0) && (local_20 = local_20 + 1, local_20 == 0)) {
    local_18 = local_18 + 1;
    local_20 = 0;
  }
  if (((local_18 & 1) == 0) && (local_20 == 0)) {
    uVar3 = 0;
  }
  else if (((local_18 & 1) == 0) || (local_20 != -1)) {
    uVar3 = (ulong)((uint)local_18 & 1);
    uVar2 = ((ulong)((uint)uVar2 & 1) + uVar3 * 2) - 2;
    pbVar1 = (byte *)((long)&(env->active_tc).DSPControl + 2);
    *pbVar1 = *pbVar1 | 0x80;
  }
  else {
    uVar3 = 0xffffffffffffffff;
  }
  return uVar2 >> 1 | uVar3 << 0x3f;
}

Assistant:

target_ulong helper_dextr_rs_l(target_ulong ac, target_ulong shift,
                               CPUMIPSState *env)
{
    uint64_t temp[3];
    uint32_t temp128;
    target_ulong ret;

    shift = shift & 0x3F;
    mipsdsp_rndrashift_acc(temp, ac, shift, env);

    temp[0] += 1;
    if (temp[0] == 0) {
        temp[1] += 1;
        if (temp[1] == 0) {
            temp[2] += 1;
        }
    }

    temp128 = temp[2] & 0x01;

    if ((temp128 != 0 || temp[1] != 0) &&
       (temp128 != 1 || temp[1] != ~0ull)) {
        if (temp128 == 0) {
            temp[1] &= ~0x00ull - 1;
            temp[0] |= ~0x00ull - 1;
        } else {
            temp[1] |= 0x01;
            temp[0] &= 0x01;
        }
        set_DSPControl_overflow_flag(1, 23, env);
    }

    ret = (temp[1] << 63) | (temp[0] >> 1);

    return ret;
}